

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

void * dja::mat4::memcpy(void *__dest,void *__src,size_t __n)

{
  vec4 *this;
  float_t *__dest_00;
  undefined1 local_54 [8];
  mat4 m;
  bool rowmajor_local;
  float_t *v_local;
  
  m.m[3].z._3_1_ = (byte)__n & 1;
  unique0x100000a8 = __src;
  mat4((mat4 *)local_54,1.0);
  this = operator[]((mat4 *)local_54,0);
  __dest_00 = vec4::operator[](this,0);
  ::memcpy(__dest_00,stack0xfffffffffffffff0,0x40);
  if ((m.m[3].z._3_1_ & 1) == 0) {
    transpose((mat4 *)__dest,(mat4 *)local_54);
  }
  else {
    ::memcpy(__dest,local_54,0x40);
  }
  return __dest;
}

Assistant:

mat4 mat4::memcpy(const float_t *v, bool rowmajor)
{
    mat4 m;
    std::memcpy(&m[0][0], v, sizeof(mat4));
    return rowmajor ? m : transpose(m);
}